

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  undefined8 in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    ImVector<ImDrawList_*>::resize
              ((ImVector<ImDrawList_*> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void Clear()                    { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }